

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OCVWarp.cpp
# Opt level: O0

string * escaped(string *__return_storage_ptr__,string *input)

{
  bool bVar1;
  reference pcVar2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_48;
  char c;
  const_iterator __end1;
  const_iterator __begin1;
  string *__range1;
  string *input_local;
  string *output;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::size();
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  __end1._M_current = (char *)std::__cxx11::string::begin();
  _Stack_48._M_current = (char *)std::__cxx11::string::end();
  while (bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffb8), bVar1) {
    pcVar2 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end1);
    switch(*pcVar2) {
    case '\a':
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\a");
      break;
    case '\b':
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\b");
      break;
    case '\t':
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\t");
      break;
    case '\n':
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\n");
      break;
    case '\v':
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\v");
      break;
    case '\f':
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\f");
      break;
    case '\r':
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\r");
      break;
    default:
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pcVar2);
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string escaped(const std::string& input)
{
	// https://stackoverflow.com/questions/48260879/how-to-replace-with-in-c-string
    std::string output;
    output.reserve(input.size());
    for (const char c: input) {
        switch (c) {
            case '\a':  output += "\\a";        break;
            case '\b':  output += "\\b";        break;
            case '\f':  output += "\\f";        break;
            case '\n':  output += "\\n";        break;
            case '\r':  output += "\\r";        break;
            case '\t':  output += "\\t";        break;
            case '\v':  output += "\\v";        break;
            default:    output += c;            break;
        }
    }

    return output;
}